

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book.cc
# Opt level: O0

void __thiscall
helix::order_book::
remove<std::map<unsigned_long,helix::price_level,std::greater<unsigned_long>,std::allocator<std::pair<unsigned_long_const,helix::price_level>>>>
          (order_book *this,order *o,
          map<unsigned_long,_helix::price_level,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
          *levels)

{
  bool bVar1;
  invalid_argument *this_00;
  pointer ppVar2;
  long *in_RSI;
  price_level *level;
  iterator it;
  map<unsigned_long,_helix::price_level,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
  *in_stack_ffffffffffffff28;
  map<unsigned_long,_helix::price_level,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
  *in_stack_ffffffffffffff30;
  iterator in_stack_ffffffffffffff38;
  allocator *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  allocator local_69;
  string local_68 [32];
  string local_48 [32];
  _Self local_28;
  _Self local_20 [2];
  long *local_10;
  
  local_10 = in_RSI;
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_helix::price_level,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
       ::find(in_stack_ffffffffffffff28,(key_type *)0x13cf68);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_helix::price_level,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
       ::end(in_stack_ffffffffffffff28);
  bVar1 = std::operator==(local_20,&local_28);
  if (!bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_helix::price_level>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_unsigned_long,_helix::price_level>_> *)
                        0x13d0d0);
    *(long *)(*local_10 + 8) = *(long *)(*local_10 + 8) - local_10[3];
    if ((ppVar2->second).size == 0) {
      std::
      map<unsigned_long,helix::price_level,std::greater<unsigned_long>,std::allocator<std::pair<unsigned_long_const,helix::price_level>>>
      ::erase_abi_cxx11_(in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
    }
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  paVar3 = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"invalid price: ",paVar3);
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff68);
  std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::invalid_argument::invalid_argument(this_00,local_48);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void order_book::remove(const order& o, T& levels)
{
    auto it = levels.find(o.price);
    if (it == levels.end()) {
        throw std::invalid_argument(std::string("invalid price: ") + std::to_string(o.price));
    }
    auto&& level = it->second;
    o.level->size -= o.quantity;
    if (level.size == 0) {
        levels.erase(it);
    }
}